

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::XFBOverrideQualifiersWithAPITest::getShaderInterface
          (XFBOverrideQualifiersWithAPITest *this,GLuint test_case_index,STAGES stage,
          string *out_interface)

{
  GLuint GVar1;
  GLchar *text;
  char *pcVar2;
  GLuint GVar3;
  size_t position;
  GLchar buffer [16];
  Type local_50;
  size_t local_40;
  GLchar local_38 [24];
  
  local_50 = TestBase::getType((TestBase *)this,test_case_index);
  GVar3 = local_50.m_n_rows;
  if (stage == GEOMETRY) {
    pcVar2 = 
    "const uint sizeof_type = SIZE;\n\nlayout (xfb_offset = 2 * sizeof_type) flat out TYPE vegeta;\n                                      flat out TYPE trunks;\nlayout (xfb_offset = 0)               flat out TYPE goku;\n                                      flat out TYPE gohan;\n\nlayout(binding = 0, std140) uniform gs_block {\n    TYPE uni_vegeta;\n    TYPE uni_trunks;\n    TYPE uni_goku;\n    TYPE uni_gohan;\n};\n"
    ;
  }
  else {
    if (stage != FRAGMENT) {
      std::__cxx11::string::_M_replace
                ((ulong)out_interface,0,(char *)out_interface->_M_string_length,0x1b3c1e9);
      return;
    }
    pcVar2 = 
    "flat in TYPE vegeta;\nflat in TYPE trunks;\nflat in TYPE goku;\nflat in TYPE gohan;\n\nout vec4 fs_out;\n"
    ;
  }
  std::__cxx11::string::_M_replace
            ((ulong)out_interface,0,(char *)out_interface->_M_string_length,(ulong)pcVar2);
  if (stage == GEOMETRY) {
    local_40 = 0;
    GVar1 = Utils::Type::GetTypeSize(local_50.m_basic_type);
    sprintf(local_38,"%d",(ulong)(GVar3 * GVar1 * local_50.m_n_columns));
    Utils::replaceToken("SIZE",&local_40,local_38,out_interface);
  }
  text = Utils::Type::GetGLSLTypeName(&local_50);
  Utils::replaceAllTokens("TYPE",text,out_interface);
  return;
}

Assistant:

void XFBOverrideQualifiersWithAPITest::getShaderInterface(GLuint test_case_index, Utils::Shader::STAGES stage,
														  std::string& out_interface)
{
	static const GLchar* gs = "const uint sizeof_type = SIZE;\n"
							  "\n"
							  "layout (xfb_offset = 2 * sizeof_type) flat out TYPE vegeta;\n"
							  "                                      flat out TYPE trunks;\n"
							  "layout (xfb_offset = 0)               flat out TYPE goku;\n"
							  "                                      flat out TYPE gohan;\n"
							  "\n"
							  /*
		 There is no packing qualifier for uniform block gs_block, according to spec, it should be "shared" by default,
		 the definition equals to "layout(binding=0, shared)", if the block is declared as shared, each block member will
		 not be packed, and each block member's layout in memory is implementation dependent, so we can't use the API
		 glBufferData() to update the UBO directly, we need to query each block member's offset first, then upload the
		 data to the corresponding offset, otherwise we can't get the correct data from UBO; to make the test passed,
		 we need to add the qualifier std140,  and change the declaration as layout(binding=0, std140), which can make
		 sure all the block members are packed and the application can upload the data by glBufferData() directly.
		 */
							  "layout(binding = 0, std140) uniform gs_block {\n"
							  "    TYPE uni_vegeta;\n"
							  "    TYPE uni_trunks;\n"
							  "    TYPE uni_goku;\n"
							  "    TYPE uni_gohan;\n"
							  "};\n";
	static const GLchar* fs = "flat in TYPE vegeta;\n"
							  "flat in TYPE trunks;\n"
							  "flat in TYPE goku;\n"
							  "flat in TYPE gohan;\n"
							  "\n"
							  "out vec4 fs_out;\n";

	const Utils::Type& type = getType(test_case_index);

	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		out_interface = fs;
		break;
	case Utils::Shader::GEOMETRY:
		out_interface = gs;
		break;
	default:
		out_interface = "";
		return;
	}

	if (Utils::Shader::GEOMETRY == stage)
	{
		GLchar		 buffer[16];
		size_t		 position  = 0;
		const GLuint type_size = type.GetSize();

		sprintf(buffer, "%d", type_size);

		Utils::replaceToken("SIZE", position, buffer, out_interface);
	}

	Utils::replaceAllTokens("TYPE", type.GetGLSLTypeName(), out_interface);
}